

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_peeling.cpp
# Opt level: O3

pair<bool,_spvtools::opt::Loop_*> __thiscall
spvtools::opt::LoopPeelingPass::ProcessLoop(LoopPeelingPass *this,Loop *loop,CodeMetrics *loop_size)

{
  Instruction *pIVar1;
  TypeManager *this_00;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  bool bVar5;
  char cVar6;
  undefined1 sign;
  uint32_t id;
  int iVar7;
  uint uVar8;
  PeelDirection PVar9;
  BasicBlock *condition_block;
  Instruction *pIVar10;
  Type *pTVar11;
  undefined4 extraout_var;
  BasicBlock *pBVar12;
  Direction DVar13;
  uint uVar14;
  IRContext *pIVar15;
  ulong uVar16;
  ScalarEvolutionAnalysis *pSVar17;
  _Hash_node_base *p_Var18;
  uint uVar19;
  IRContext *pIVar21;
  pair<bool,_spvtools::opt::Loop_*> pVar22;
  size_t iterations;
  Instruction *canonical_induction_variable;
  LoopPeelingInfo peel_info;
  LoopPeeling peeler;
  uint local_114;
  size_t local_110;
  Instruction *local_108;
  PeelDirection local_fc;
  Loop *local_f8;
  CodeMetrics *local_f0;
  LoopPeelingInfo local_e8;
  LoopPeeling local_c8;
  Loop *pLVar20;
  
  pIVar15 = (this->super_Pass).context_;
  local_f8 = loop;
  if ((pIVar15->valid_analyses_ & kAnalysisScalarEvolution) == kAnalysisNone) {
    IRContext::BuildScalarEvolutionAnalysis(pIVar15);
  }
  pSVar17 = (pIVar15->scalar_evolution_analysis_)._M_t.
            super___uniq_ptr_impl<spvtools::opt::ScalarEvolutionAnalysis,_std::default_delete<spvtools::opt::ScalarEvolutionAnalysis>_>
            ._M_t.
            super__Tuple_impl<0UL,_spvtools::opt::ScalarEvolutionAnalysis_*,_std::default_delete<spvtools::opt::ScalarEvolutionAnalysis>_>
            .super__Head_base<0UL,_spvtools::opt::ScalarEvolutionAnalysis_*,_false>._M_head_impl;
  condition_block = Loop::FindConditionBlock(loop);
  if ((condition_block == (BasicBlock *)0x0) ||
     (pIVar10 = Loop::FindConditionVariable(loop,condition_block), pIVar10 == (Instruction *)0x0)) {
    uVar16 = 0;
    pLVar20 = (Loop *)0x0;
    goto LAB_005e3a08;
  }
  local_110 = 0;
  pIVar1 = (condition_block->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
           super_IntrusiveNodeBase<spvtools::opt::Instruction>.next_node_;
  local_f0 = loop_size;
  if ((pIVar1 == (Instruction *)0x0) ||
     ((pIVar1->super_IntrusiveNodeBase<spvtools::opt::Instruction>).is_sentinel_ != false)) {
    __assert_fail("!insts_.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/basic_block.h"
                  ,0x78,"iterator spvtools::opt::BasicBlock::tail()");
  }
  pLVar20 = (Loop *)0x0;
  bVar5 = Loop::FindNumberOfIterations
                    (loop,pIVar10,
                     (condition_block->insts_).super_IntrusiveList<spvtools::opt::Instruction>.
                     sentinel_.super_IntrusiveNodeBase<spvtools::opt::Instruction>.previous_node_,
                     &local_110,(int64_t *)0x0,(int64_t *)0x0);
  uVar16 = 0;
  if ((!bVar5) || (local_110 == 0)) goto LAB_005e3a08;
  local_108 = (Instruction *)0x0;
  pBVar12 = loop->loop_header_;
  local_c8.loop_utils_.context_ = (IRContext *)0x0;
  local_c8.context_ = (IRContext *)operator_new(0x18);
  (local_c8.context_)->syntax_context_ = (spv_context)&local_108;
  *(ScalarEvolutionAnalysis **)&(local_c8.context_)->grammar_ = pSVar17;
  ((local_c8.context_)->grammar_).operandTable_ = (spv_operand_table)this;
  local_c8.loop_utils_.loop_ =
       (Loop *)std::
               _Function_handler<bool_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/loop_peeling.cpp:652:44)>
               ::_M_invoke;
  local_c8.loop_utils_.loop_desc_ =
       (LoopDescriptor *)
       std::
       _Function_handler<bool_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/loop_peeling.cpp:652:44)>
       ::_M_manager;
  pIVar15 = (IRContext *)
            (pBVar12->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
            super_IntrusiveNodeBase<spvtools::opt::Instruction>.next_node_;
  if ((pIVar15 == (IRContext *)0x0) || (*(bool *)&(pIVar15->grammar_).opcodeTable_ != false)) {
LAB_005e381e:
    (*(code *)local_c8.loop_utils_.loop_desc_)(&local_c8,&local_c8,3);
  }
  else {
    do {
      if (pIVar15 == (IRContext *)0x0) break;
      pIVar21 = *(IRContext **)&pIVar15->grammar_;
      if (*(bool *)&(pIVar21->grammar_).opcodeTable_ != false) {
        pIVar21 = (IRContext *)0x0;
      }
      if (pIVar15->unique_id_ != OpPhi) break;
      local_e8.context_ = pIVar15;
      if (local_c8.loop_utils_.loop_desc_ == (LoopDescriptor *)0x0) {
        std::__throw_bad_function_call();
      }
      cVar6 = (*(code *)local_c8.loop_utils_.loop_)(&local_c8);
      pIVar15 = pIVar21;
    } while (cVar6 != '\0');
    if (local_c8.loop_utils_.loop_desc_ != (LoopDescriptor *)0x0) goto LAB_005e381e;
  }
  if (local_108 == (Instruction *)0x0) {
    sign = false;
  }
  else {
    pIVar15 = (this->super_Pass).context_;
    if ((pIVar15->valid_analyses_ & kAnalysisTypes) == kAnalysisNone) {
      IRContext::BuildTypeManager(pIVar15);
    }
    this_00 = (pIVar15->type_mgr_)._M_t.
              super___uniq_ptr_impl<spvtools::opt::analysis::TypeManager,_std::default_delete<spvtools::opt::analysis::TypeManager>_>
              ._M_t.
              super__Tuple_impl<0UL,_spvtools::opt::analysis::TypeManager_*,_std::default_delete<spvtools::opt::analysis::TypeManager>_>
              .super__Head_base<0UL,_spvtools::opt::analysis::TypeManager_*,_false>._M_head_impl;
    id = 0;
    if (local_108->has_type_id_ == true) {
      id = Instruction::GetSingleWordOperand(local_108,0);
    }
    pTVar11 = analysis::TypeManager::GetType(this_00,id);
    iVar7 = (*pTVar11->_vptr_Type[9])(pTVar11);
    sign = *(undefined1 *)(CONCAT44(extraout_var,iVar7) + 0x28);
  }
  local_e8.context_ = (this->super_Pass).context_;
  local_e8.loop_ = (Loop *)loop->loop_header_;
  local_e8.scev_analysis_ = (ScalarEvolutionAnalysis *)&(local_e8.loop_)->loop_merge_;
  local_e8.loop_max_iterations_ = CONCAT44(local_e8.loop_max_iterations_._4_4_,3);
  pIVar10 = InstructionBuilder::GetIntConstant<unsigned_int>
                      ((InstructionBuilder *)&local_e8,(uint)local_110,(bool)sign);
  LoopPeeling::LoopPeeling(&local_c8,loop,pIVar10,local_108);
  bVar5 = LoopPeeling::CanPeelLoop(&local_c8);
  uVar19 = 0;
  pLVar20 = (Loop *)0x0;
  if (bVar5) {
    local_e8.context_ = loop->context_;
    local_e8.loop_max_iterations_ = local_110;
    p_Var18 = (loop->loop_basic_blocks_)._M_h._M_before_begin._M_nxt;
    uVar2 = 0;
    local_e8.loop_ = loop;
    local_e8.scev_analysis_ = pSVar17;
    if (p_Var18 != (_Hash_node_base *)0x0) {
      uVar2 = 0;
      uVar19 = 0;
      do {
        uVar14 = *(uint *)&p_Var18[1]._M_nxt;
        pSVar17 = (ScalarEvolutionAnalysis *)(ulong)uVar14;
        pIVar10 = (condition_block->label_)._M_t.
                  super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                  .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
        uVar8 = 0;
        if (pIVar10->has_result_id_ == true) {
          uVar8 = Instruction::GetSingleWordOperand(pIVar10,(uint)pIVar10->has_type_id_);
        }
        uVar3 = uVar19;
        uVar4 = uVar2;
        if (uVar14 != uVar8) {
          pIVar15 = (this->super_Pass).context_;
          if ((pIVar15->valid_analyses_ & kAnalysisCFG) == kAnalysisNone) {
            IRContext::BuildCFG(pIVar15);
          }
          pBVar12 = CFG::block((pIVar15->cfg_)._M_t.
                               super___uniq_ptr_impl<spvtools::opt::CFG,_std::default_delete<spvtools::opt::CFG>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_spvtools::opt::CFG_*,_std::default_delete<spvtools::opt::CFG>_>
                               .super__Head_base<0UL,_spvtools::opt::CFG_*,_false>._M_head_impl,
                               uVar14);
          DVar13 = LoopPeelingInfo::GetPeelingInfo(&local_e8,pBVar12);
          PVar9 = DVar13.first;
          if (PVar9 != kNone) {
            uVar14 = DVar13.second;
            if (PVar9 == kAfter) {
              uVar3 = uVar14;
              if (uVar14 < uVar19) {
                uVar3 = uVar19;
              }
            }
            else {
              if (PVar9 != kBefore) {
                __assert_fail("direction == PeelDirection::kAfter",
                              "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/loop_peeling.cpp"
                              ,0x2c9,
                              "std::pair<bool, Loop *> spvtools::opt::LoopPeelingPass::ProcessLoop(Loop *, CodeMetrics *)"
                             );
              }
              uVar4 = uVar14;
              if (uVar14 < uVar2) {
                uVar4 = uVar2;
              }
            }
          }
        }
        uVar2 = uVar4;
        uVar19 = uVar3;
        p_Var18 = p_Var18->_M_nxt;
      } while (p_Var18 != (_Hash_node_base *)0x0);
    }
    local_114 = uVar19;
    if (((uVar19 <= uVar2 || uVar19 == 0) && (local_114 = uVar2, uVar2 == 0)) ||
       (uVar16 = (ulong)local_114 * local_f0->roi_size_,
       code_grow_threshold_ <= uVar16 && uVar16 - code_grow_threshold_ != 0)) {
      uVar16 = 0;
    }
    else {
      local_f0->roi_size_ = uVar16;
      if ((uVar19 <= uVar2 || uVar19 == 0) && uVar2 != 0) {
        LoopPeeling::PeelBefore(&local_c8,local_114);
        pLVar20 = local_c8.loop_;
        uVar2 = uVar19;
        if ((vector<std::tuple<spvtools::opt::Loop_const*,spvtools::opt::LoopPeelingPass::PeelDirection,unsigned_int>,std::allocator<std::tuple<spvtools::opt::Loop_const*,spvtools::opt::LoopPeelingPass::PeelDirection,unsigned_int>>>
             *)this->stats_ !=
            (vector<std::tuple<spvtools::opt::Loop_const*,spvtools::opt::LoopPeelingPass::PeelDirection,unsigned_int>,std::allocator<std::tuple<spvtools::opt::Loop_const*,spvtools::opt::LoopPeelingPass::PeelDirection,unsigned_int>>>
             *)0x0) {
          local_fc = kBefore;
          std::
          vector<std::tuple<spvtools::opt::Loop_const*,spvtools::opt::LoopPeelingPass::PeelDirection,unsigned_int>,std::allocator<std::tuple<spvtools::opt::Loop_const*,spvtools::opt::LoopPeelingPass::PeelDirection,unsigned_int>>>
          ::
          emplace_back<spvtools::opt::Loop*&,spvtools::opt::LoopPeelingPass::PeelDirection,unsigned_int&>
                    ((vector<std::tuple<spvtools::opt::Loop_const*,spvtools::opt::LoopPeelingPass::PeelDirection,unsigned_int>,std::allocator<std::tuple<spvtools::opt::Loop_const*,spvtools::opt::LoopPeelingPass::PeelDirection,unsigned_int>>>
                      *)this->stats_,&local_f8,&local_fc,&local_114);
          pLVar20 = local_c8.loop_;
        }
      }
      else {
        LoopPeeling::PeelAfter(&local_c8,local_114);
        pLVar20 = local_c8.cloned_loop_;
        if ((vector<std::tuple<spvtools::opt::Loop_const*,spvtools::opt::LoopPeelingPass::PeelDirection,unsigned_int>,std::allocator<std::tuple<spvtools::opt::Loop_const*,spvtools::opt::LoopPeelingPass::PeelDirection,unsigned_int>>>
             *)this->stats_ !=
            (vector<std::tuple<spvtools::opt::Loop_const*,spvtools::opt::LoopPeelingPass::PeelDirection,unsigned_int>,std::allocator<std::tuple<spvtools::opt::Loop_const*,spvtools::opt::LoopPeelingPass::PeelDirection,unsigned_int>>>
             *)0x0) {
          local_fc = kAfter;
          std::
          vector<std::tuple<spvtools::opt::Loop_const*,spvtools::opt::LoopPeelingPass::PeelDirection,unsigned_int>,std::allocator<std::tuple<spvtools::opt::Loop_const*,spvtools::opt::LoopPeelingPass::PeelDirection,unsigned_int>>>
          ::
          emplace_back<spvtools::opt::Loop*&,spvtools::opt::LoopPeelingPass::PeelDirection,unsigned_int&>
                    ((vector<std::tuple<spvtools::opt::Loop_const*,spvtools::opt::LoopPeelingPass::PeelDirection,unsigned_int>,std::allocator<std::tuple<spvtools::opt::Loop_const*,spvtools::opt::LoopPeelingPass::PeelDirection,unsigned_int>>>
                      *)this->stats_,&local_f8,&local_fc,&local_114);
          pLVar20 = local_c8.cloned_loop_;
        }
      }
      uVar16 = CONCAT71((int7)((ulong)pSVar17 >> 8),1);
      if (uVar2 != 0) goto LAB_005e39fb;
    }
    pLVar20 = (Loop *)0x0;
  }
  else {
    uVar16 = 0;
  }
LAB_005e39fb:
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&local_c8.exit_value_._M_h);
LAB_005e3a08:
  pVar22._0_8_ = uVar16 & 0xffffffff;
  pVar22.second = pLVar20;
  return pVar22;
}

Assistant:

std::pair<bool, Loop*> LoopPeelingPass::ProcessLoop(Loop* loop,
                                                    CodeMetrics* loop_size) {
  ScalarEvolutionAnalysis* scev_analysis =
      context()->GetScalarEvolutionAnalysis();
  // Default values for bailing out.
  std::pair<bool, Loop*> bail_out{false, nullptr};

  BasicBlock* exit_block = loop->FindConditionBlock();
  if (!exit_block) {
    return bail_out;
  }

  Instruction* exiting_iv = loop->FindConditionVariable(exit_block);
  if (!exiting_iv) {
    return bail_out;
  }
  size_t iterations = 0;
  if (!loop->FindNumberOfIterations(exiting_iv, &*exit_block->tail(),
                                    &iterations)) {
    return bail_out;
  }
  if (!iterations) {
    return bail_out;
  }

  Instruction* canonical_induction_variable = nullptr;

  loop->GetHeaderBlock()->WhileEachPhiInst([&canonical_induction_variable,
                                            scev_analysis,
                                            this](Instruction* insn) {
    if (const SERecurrentNode* iv =
            scev_analysis->AnalyzeInstruction(insn)->AsSERecurrentNode()) {
      const SEConstantNode* offset = iv->GetOffset()->AsSEConstantNode();
      const SEConstantNode* coeff = iv->GetCoefficient()->AsSEConstantNode();
      if (offset && coeff && offset->FoldToSingleValue() == 0 &&
          coeff->FoldToSingleValue() == 1) {
        if (context()->get_type_mgr()->GetType(insn->type_id())->AsInteger()) {
          canonical_induction_variable = insn;
          return false;
        }
      }
    }
    return true;
  });

  bool is_signed = canonical_induction_variable
                       ? context()
                             ->get_type_mgr()
                             ->GetType(canonical_induction_variable->type_id())
                             ->AsInteger()
                             ->IsSigned()
                       : false;

  LoopPeeling peeler(
      loop,
      InstructionBuilder(
          context(), loop->GetHeaderBlock(),
          IRContext::kAnalysisDefUse | IRContext::kAnalysisInstrToBlockMapping)
          .GetIntConstant<uint32_t>(static_cast<uint32_t>(iterations),
                                    is_signed),
      canonical_induction_variable);

  if (!peeler.CanPeelLoop()) {
    return bail_out;
  }

  // For each basic block in the loop, check if it can be peeled. If it
  // can, get the direction (before/after) and by which factor.
  LoopPeelingInfo peel_info(loop, iterations, scev_analysis);

  uint32_t peel_before_factor = 0;
  uint32_t peel_after_factor = 0;

  for (uint32_t block : loop->GetBlocks()) {
    if (block == exit_block->id()) {
      continue;
    }
    BasicBlock* bb = cfg()->block(block);
    PeelDirection direction;
    uint32_t factor;
    std::tie(direction, factor) = peel_info.GetPeelingInfo(bb);

    if (direction == PeelDirection::kNone) {
      continue;
    }
    if (direction == PeelDirection::kBefore) {
      peel_before_factor = std::max(peel_before_factor, factor);
    } else {
      assert(direction == PeelDirection::kAfter);
      peel_after_factor = std::max(peel_after_factor, factor);
    }
  }
  PeelDirection direction = PeelDirection::kNone;
  uint32_t factor = 0;

  // Find which direction we should peel.
  if (peel_before_factor) {
    factor = peel_before_factor;
    direction = PeelDirection::kBefore;
  }
  if (peel_after_factor) {
    if (peel_before_factor < peel_after_factor) {
      // Favor a peel after here and give the peel before another shot later.
      factor = peel_after_factor;
      direction = PeelDirection::kAfter;
    }
  }

  // Do the peel if we can.
  if (direction == PeelDirection::kNone) return bail_out;

  // This does not take into account branch elimination opportunities and
  // the unrolling. It assumes the peeled loop will be unrolled as well.
  if (factor * loop_size->roi_size_ > code_grow_threshold_) {
    return bail_out;
  }
  loop_size->roi_size_ *= factor;

  // Find if a loop should be peeled again.
  Loop* extra_opportunity = nullptr;

  if (direction == PeelDirection::kBefore) {
    peeler.PeelBefore(factor);
    if (stats_) {
      stats_->peeled_loops_.emplace_back(loop, PeelDirection::kBefore, factor);
    }
    if (peel_after_factor) {
      // We could have peeled after, give it another try.
      extra_opportunity = peeler.GetOriginalLoop();
    }
  } else {
    peeler.PeelAfter(factor);
    if (stats_) {
      stats_->peeled_loops_.emplace_back(loop, PeelDirection::kAfter, factor);
    }
    if (peel_before_factor) {
      // We could have peeled before, give it another try.
      extra_opportunity = peeler.GetClonedLoop();
    }
  }

  return {true, extra_opportunity};
}